

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendImageCopyToMemoryExt
          (ze_command_list_handle_t hCommandList,void *dstptr,ze_image_handle_t hSrcImage,
          ze_image_region_t *pSrcRegion,uint32_t destRowPitch,uint32_t destSlicePitch,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ze_pfnCommandListAppendImageCopyToMemoryExt_t pfnAppendImageCopyToMemoryExt;
  ze_result_t result;
  uint32_t destSlicePitch_local;
  uint32_t destRowPitch_local;
  ze_image_region_t *pSrcRegion_local;
  ze_image_handle_t hSrcImage_local;
  void *dstptr_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendImageCopyToMemoryExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c418 != (code *)0x0) {
    pfnAppendImageCopyToMemoryExt._4_4_ =
         (*DAT_0011c418)(hCommandList,dstptr,hSrcImage,pSrcRegion,destRowPitch,destSlicePitch,
                         hSignalEvent,numWaitEvents,phWaitEvents);
  }
  return pfnAppendImageCopyToMemoryExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyToMemoryExt(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        void* dstptr,                                   ///< [in] pointer to destination memory to copy to
        ze_image_handle_t hSrcImage,                    ///< [in] handle of source image to copy from
        const ze_image_region_t* pSrcRegion,            ///< [in][optional] source region descriptor
        uint32_t destRowPitch,                          ///< [in] size in bytes of the 1D slice of the 2D region of a 2D or 3D
                                                        ///< image or each image of a 1D or 2D image array being written
        uint32_t destSlicePitch,                        ///< [in] size in bytes of the 2D slice of the 3D region of a 3D image or
                                                        ///< each image of a 1D or 2D image array being written
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendImageCopyToMemoryExt = context.zeDdiTable.CommandList.pfnAppendImageCopyToMemoryExt;
        if( nullptr != pfnAppendImageCopyToMemoryExt )
        {
            result = pfnAppendImageCopyToMemoryExt( hCommandList, dstptr, hSrcImage, pSrcRegion, destRowPitch, destSlicePitch, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }